

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_metrics * cram_new_metrics(void)

{
  cram_metrics *pcVar1;
  
  pcVar1 = (cram_metrics *)calloc(1,0x78);
  if (pcVar1 != (cram_metrics *)0x0) {
    pcVar1->trial = 2;
    pcVar1->next_trial = 0x32;
  }
  return pcVar1;
}

Assistant:

cram_metrics *cram_new_metrics(void) {
    cram_metrics *m = calloc(1, sizeof(*m));
    if (!m)
	return NULL;
    m->trial = NTRIALS-1;
    m->next_trial = TRIAL_SPAN;
    m->method = RAW;
    m->strat = 0;
    m->revised_method = 0;

    return m;
}